

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
parseOctalLiteral(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  *this)

{
  char *pcVar1;
  bool bVar2;
  UnicodeChar UVar3;
  UTF8Reader temp;
  UTF8Reader t;
  anon_class_8_1_8991fb9c local_38;
  UTF8Reader local_30;
  UTF8Reader local_28;
  UTF8Reader local_20;
  
  pcVar1 = (this->input).data;
  local_20.data = pcVar1;
  UVar3 = UTF8Reader::operator*(&local_20);
  if ((UVar3 == 0x30) &&
     (local_28.data = pcVar1, UTF8Reader::operator++(&local_28), (byte)(*local_28.data - 0x30U) < 10
     )) {
    local_38.this = this;
    local_30.data = pcVar1;
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::
            parseIntegerWithBase<8,soul::Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>::parseOctalLiteral()::_lambda(unsigned_int)_1_>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,&local_30,&local_38);
    return bVar2;
  }
  return false;
}

Assistant:

bool parseOctalLiteral()
    {
        auto t = input;

        return *t == '0' && (t + 1).isDigit()
                && parseIntegerWithBase<8> (t, [this] (UnicodeChar c) -> int
                                               {
                                                    if (c >= '0' && c <= '7')  return ((int) c) - '0';
                                                    if (c == '8' || c == '9')  throwError (Errors::decimalDigitInOctal());
                                                    return -1;
                                               });
    }